

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall
wasm_functype_t::wasm_functype_t
          (wasm_functype_t *this,wasm_valtype_vec_t *params,wasm_valtype_vec_t *results)

{
  wasm_valtype_t **ppwVar1;
  pointer *__ptr;
  undefined1 local_68 [32];
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  ToWabtValueTypes((ValueTypes *)&local_48,params);
  ToWabtValueTypes((ValueTypes *)(local_68 + 8),results);
  std::
  make_unique<wabt::interp::FuncType,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>>
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_68,
             (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_48);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_00238c10;
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (ExternType *)local_68._0_8_;
  local_68._0_8_ = (pointer)0x0;
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)(local_68 + 8));
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_48);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_functype_t_00238bc8;
  ppwVar1 = params->data;
  (this->params).size = params->size;
  (this->params).data = ppwVar1;
  ppwVar1 = results->data;
  (this->results).size = results->size;
  (this->results).data = ppwVar1;
  return;
}

Assistant:

wasm_functype_t(own wasm_valtype_vec_t* params,
                  own wasm_valtype_vec_t* results)
      : wasm_externtype_t{std::make_unique<FuncType>(
            ToWabtValueTypes(params),
            ToWabtValueTypes(results))},
        params(*params),
        results(*results) {}